

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport-sysfs-gpio.c
# Opt level: O0

int file_get(char *path,char *dbuf,int dlen)

{
  int __fd;
  ssize_t sVar1;
  int local_28;
  int fd;
  int ret;
  int dlen_local;
  char *dbuf_local;
  char *path_local;
  
  __fd = open(path,0);
  if (__fd == -1) {
    slog(0,5,"sysfsgpio: Failed to open %s for reading",path);
    path_local._4_4_ = -1;
  }
  else {
    sVar1 = read(__fd,dbuf,(long)(dlen + -1));
    local_28 = (int)sVar1;
    if (local_28 == -1) {
      local_28 = 0;
    }
    dbuf[local_28] = '\0';
    close(__fd);
    path_local._4_4_ = local_28;
  }
  return path_local._4_4_;
}

Assistant:

static int file_get(const char *path, char *dbuf, int dlen)
{
	int ret;
	int fd = open(path, O_RDONLY);

	if (-1 == fd) {
		slog(0, SLOG_ERROR, "sysfsgpio: Failed to open %s for reading", path);
		return -1;
	}
	ret = read(fd, dbuf, dlen - 1);
	if (ret == -1)
		ret = 0;
	dbuf[ret]=0x0;
	close(fd);
	return ret;
}